

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnElemSegmentFunctionIndex
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  Index index;
  size_type sVar1;
  reference ppEVar2;
  Location local_98;
  Var local_78;
  reference local_30;
  Var *var;
  ElemSegment *segment;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderIR *this_local;
  
  segment._0_4_ = func_index;
  segment._4_4_ = segment_index;
  _func_index_local = this;
  sVar1 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)segment_index == sVar1 - 1) {
    ppEVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                        (&this->module_->elem_segments,(ulong)segment._4_4_);
    var = (Var *)*ppEVar2;
    std::vector<wabt::Var,_std::allocator<wabt::Var>_>::emplace_back<>(&((value_type)var)->vars);
    local_30 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::back
                         ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)
                          ((long)&var[1].field_2 + 0x18));
    index = (Index)segment;
    GetLocation(&local_98,this);
    Var::Var(&local_78,index,&local_98);
    Var::operator=(local_30,&local_78);
    Var::~Var(&local_78);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x3e5,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentFunctionIndex(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentFunctionIndex(Index segment_index,
                                                  Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->vars.emplace_back();
  Var* var = &segment->vars.back();
  *var = Var(func_index, GetLocation());
  return Result::Ok;
}